

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O2

void sysbvm_stackFrame_breakInto(sysbvm_stackFrameRecord_t *targetRecord)

{
  _Bool _Var1;
  long in_FS_OFFSET;
  
  _Var1 = sysbvm_stackFrame_isValidRecordInThisContext(targetRecord);
  if ((!_Var1) || (targetRecord->type != SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET)) {
    sysbvm_error("Cannot unwind for break into invalid target.");
  }
  sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
  *(sysbvm_stackFrameRecord_t **)(in_FS_OFFSET + -0x10) = targetRecord;
  longjmp((__jmp_buf_tag *)&targetRecord[1].type,1);
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_breakInto(sysbvm_stackFrameRecord_t *targetRecord)
{
    if(!sysbvm_stackFrame_isValidRecordInThisContext(targetRecord)
        || targetRecord->type != SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET)
        sysbvm_error("Cannot unwind for break into invalid target.");

    sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
    sysbvm_stackFrameBreakTargetRecord_t *breakRecord = (sysbvm_stackFrameBreakTargetRecord_t*)targetRecord;
    sysbvm_stackFrame_activeRecord = targetRecord;
    longjmp(breakRecord->jmpbuffer, 1);
}